

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  size_t sVar2;
  pointer pcVar3;
  char *pcVar4;
  typed_value<unsigned_long,_char> *ptVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
  *ptVar7;
  const_iterator cVar8;
  long *plVar9;
  any *paVar10;
  unsigned_long *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar13;
  test_call_type p_Var14;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  divisor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integer_type;
  variables_map vm;
  options_description description;
  allocator<char> local_1e1;
  undefined1 local_1e0 [32];
  stored_head_type local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  string local_198;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  tail_type local_158;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  long *local_d8 [2];
  long local_c8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  long local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,anon_var_dwarf_1b200,anon_var_dwarf_1b200 + 10);
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_178,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
  }
  local_198._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_198,"help,h");
  ptVar5 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_1b8[0] = (long *)0x3e8;
  ptVar5 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar5,(unsigned_long *)local_1b8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"attempts",(char *)ptVar5);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = local_1e0 + 0x10;
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"int32","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1e0);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"integer",(char *)ptVar6);
  ptVar7 = boost::program_options::
           value<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                       *)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_178,"int32",&local_1e1);
  local_158.head = 100;
  ptVar7 = boost::program_options::
           typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
           ::default_value(ptVar7,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                                   *)local_178);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"divisor",(char *)ptVar7);
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
  }
  if ((pointer)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1e0,argc,argv,(options_description *)local_d8,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_1e0,(variables_map *)local_178,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1e0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_178);
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"help","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)local_168,(key_type *)local_1e0);
  if ((pointer)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (cVar8._M_node == (_Base_ptr)(local_168 + 8)) {
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"attempts","");
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    puVar11 = boost::any_cast<unsigned_long_const&>(paVar10);
    sVar2 = *puVar11;
    if ((pointer)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"integer","");
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
    pcVar3 = (pbVar12->_M_dataplus)._M_p;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar3,pcVar3 + pbVar12->_M_string_length);
    if ((pointer)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"divisor","");
    paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    ptVar13 = boost::
              any_cast<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>const&>
                        (paVar10);
    pcVar3 = (ptVar13->super_type).head._M_dataplus._M_p;
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e0,pcVar3,pcVar3 + (ptVar13->super_type).head._M_string_length);
    local_1c0 = (ptVar13->super_type).tail.head;
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    p_Var14 = get_call(&local_198,(string *)local_1e0);
    (*p_Var14)(local_1c0,sVar2);
    if ((pointer)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    plVar9 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_d8);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  }
  local_178._0_8_ = std::ios::clear;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_168);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_78 - (long)local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("integer", bpo::value<std::string>()->default_value("int32"),
            "Тип сортируемых чисел.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64")
        ("divisor", bpo::value<boost::tuple<std::string, std::int64_t>>()->default_value(boost::make_tuple("int32", 100)),
            "Тип делителя.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto attempts = vm["attempts"].as<std::size_t>();
            auto integer_type = vm["integer"].as<std::string>();
            auto divisor = vm["divisor"].as<boost::tuple<std::string, std::int64_t>>();

            auto test = get_call(integer_type, boost::get<0>(divisor));
            test(boost::get<1>(divisor), attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}